

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_init(void)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  
  iVar1 = _comex_init((MPI_Comm)CONCAT44(in_register_00000004,in_EAX));
  return iVar1;
}

Assistant:

int _comex_init(MPI_Comm comm)
{
    int status;
    int init_flag;
    
    if (initialized) {
        return COMEX_SUCCESS;
    }
    initialized = 1;

    /* Assert MPI has been initialized */
    status = MPI_Initialized(&init_flag);
    assert(MPI_SUCCESS == status);
    assert(init_flag);
    
    /* Duplicate the World Communicator */
    status = MPI_Comm_dup(comm, &(l_state.world_comm));
    assert(MPI_SUCCESS == status);
    assert(l_state.world_comm); 

    /* My Rank */
    status = MPI_Comm_rank(l_state.world_comm, &(l_state.rank));
    assert(MPI_SUCCESS == status);
    comex_me = l_state.rank;

    /* World Size */
    status = MPI_Comm_size(l_state.world_comm, &(l_state.size));
    assert(MPI_SUCCESS == status);
    comex_nproc = l_state.size;
    
    /* groups */
    comex_group_init();

    /* static state */
    /* TODO: consider using calloc instead of malloc+memset? */
    fence_array = malloc(sizeof(char) * l_state.size);
    (void)memset(fence_array, 0, l_state.size);

#if DEBUG_TO_FILE
    {
        char pathname[80];
        sprintf(pathname, "trace.%d.log", l_state.rank);
        my_file = fopen(pathname, "w");
    }
#endif

    /* mutexes */
    l_state.mutexes = NULL;
    l_state.num_mutexes = 0;
    l_state.lq_head = NULL;
    l_state.lq_tail = NULL;

    /* Synch - Sanity Check */
    comex_barrier(COMEX_GROUP_WORLD);

    return COMEX_SUCCESS;
}